

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::TraverseSchema::processBaseTypeInfo
          (TraverseSchema *this,DOMElement *elem,XMLCh *baseName,XMLCh *localPart,XMLCh *uriStr,
          ComplexTypeInfo *typeInfo)

{
  XMLBuffer *this_00;
  SchemaInfo **enclosingSchema;
  XMLCh XVar1;
  uint saveScope;
  SchemaInfo *toRestore;
  RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher> *pRVar2;
  ValueVectorOf<int> *pVVar3;
  ValueVectorOf<unsigned_int> *pVVar4;
  uint *puVar5;
  SchemaInfo *pSVar6;
  RefVectorOf<xercesc_4_0::SchemaInfo> *pRVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  XMLCh *pXVar12;
  DatatypeValidator *pDVar13;
  DOMElement *pDVar14;
  undefined4 extraout_var;
  ComplexTypeInfo *pCVar15;
  SchemaInfo *toRestore_00;
  undefined4 *puVar16;
  XMLCh *pXVar17;
  RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *pRVar18;
  ushort *puVar19;
  XMLCh XVar20;
  ushort uVar21;
  ulong uVar22;
  ulong uVar23;
  XMLSize_t XVar24;
  XMLSize_t getAt;
  bool bVar25;
  ListType local_60;
  ushort *key1;
  
  toRestore = this->fSchemaInfo;
  saveScope = this->fCurrentScope;
  pXVar12 = this->fTargetNSURIString;
  if (pXVar12 == uriStr) {
LAB_0033a223:
    this_00 = &this->fBuffer;
    (this->fBuffer).fIndex = 0;
    if ((uriStr != (XMLCh *)0x0) && (*uriStr != L'\0')) {
      XMLBuffer::append(this_00,uriStr);
    }
    if ((this->fBuffer).fIndex == (this->fBuffer).fCapacity) {
      XMLBuffer::ensureCapacity(this_00,1);
    }
    XVar24 = (this->fBuffer).fIndex;
    (this->fBuffer).fIndex = XVar24 + 1;
    (this->fBuffer).fBuffer[XVar24] = L',';
    XMLBuffer::append(this_00,localPart);
    pXVar12 = (this->fBuffer).fBuffer;
    pXVar12[(this->fBuffer).fIndex] = L'\0';
    pRVar2 = this->fComplexTypeRegistry;
    if ((pXVar12 == (XMLCh *)0x0) || (uVar11 = (ulong)(ushort)*pXVar12, uVar11 == 0)) {
      uVar11 = 0;
    }
    else {
      XVar20 = pXVar12[1];
      if (XVar20 != L'\0') {
        pXVar17 = pXVar12 + 2;
        do {
          uVar11 = (ulong)(ushort)XVar20 + (uVar11 >> 0x18) + uVar11 * 0x26;
          XVar20 = *pXVar17;
          pXVar17 = pXVar17 + 1;
        } while (XVar20 != L'\0');
      }
      uVar11 = uVar11 % pRVar2->fHashModulus;
    }
    pRVar18 = pRVar2->fBucketList[uVar11];
    if (pRVar18 != (RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *)0x0) {
      do {
        bVar25 = StringHasher::equals((StringHasher *)&pRVar2->field_0x30,pXVar12,pRVar18->fKey);
        if (bVar25) goto LAB_0033a3e3;
        pRVar18 = pRVar18->fNext;
      } while (pRVar18 != (RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *)0x0);
    }
    pRVar18 = (RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *)0x0;
LAB_0033a3e3:
    if (pRVar18 == (RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *)0x0) {
      pCVar15 = (ComplexTypeInfo *)0x0;
    }
    else {
      pCVar15 = pRVar18->fData;
    }
    if (pCVar15 != (ComplexTypeInfo *)0x0) {
      pVVar4 = this->fCurrentTypeNameStack;
      uVar9 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[5])
                        (this->fStringPool,pXVar12);
      uVar11 = this->fCircularCheckIndex;
      uVar22 = pVVar4->fCurCount;
      if (uVar11 < uVar22) {
        puVar5 = pVVar4->fElemList;
        if (puVar5[uVar11] != uVar9) {
          do {
            uVar11 = uVar11 + 1;
            if (uVar22 == uVar11) break;
          } while (puVar5[uVar11] != uVar9);
          goto LAB_0033a44e;
        }
      }
      else {
LAB_0033a44e:
        if (uVar22 <= uVar11) {
          pVVar4 = this->fCurrentTypeNameStack;
          uVar9 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[5])
                            (this->fStringPool,pXVar12);
          uVar11 = pVVar4->fCurCount;
          bVar25 = uVar11 != 0;
          if (uVar11 == 0) {
LAB_0033a4a1:
            if (!bVar25) {
              if (pCVar15->fPreprocessed != false) {
                pCVar15 = (ComplexTypeInfo *)0x0;
              }
              goto LAB_0033a4cb;
            }
          }
          else {
            puVar5 = pVVar4->fElemList;
            if (*puVar5 != uVar9) {
              uVar22 = 1;
              do {
                uVar23 = uVar22;
                if (uVar11 == uVar23) break;
                uVar22 = uVar23 + 1;
              } while (puVar5[uVar23] != uVar9);
              bVar25 = uVar23 < uVar11;
              goto LAB_0033a4a1;
            }
          }
          typeInfo->fBaseComplexTypeInfo = pCVar15;
          puVar16 = (undefined4 *)__cxa_allocate_exception(4);
          *puVar16 = 2;
          goto LAB_0033a81a;
        }
      }
      iVar10 = 0x56;
      goto LAB_0033a802;
    }
    pCVar15 = (ComplexTypeInfo *)0x0;
LAB_0033a4cb:
    local_60 = INCLUDE;
    pDVar13 = (DatatypeValidator *)0x0;
LAB_0033a4d0:
    enclosingSchema = &this->fSchemaInfo;
    if (pDVar13 != (DatatypeValidator *)0x0 || pCVar15 != (ComplexTypeInfo *)0x0) goto LAB_0033a4fd;
    pDVar13 = getDatatypeValidator(this,uriStr,localPart);
    if (pDVar13 != (DatatypeValidator *)0x0) {
LAB_0033a4fa:
      pCVar15 = (ComplexTypeInfo *)0x0;
LAB_0033a4fd:
      if (toRestore != *enclosingSchema) {
        restoreSchemaInfo(this,toRestore,local_60,saveScope);
      }
      typeInfo->fBaseComplexTypeInfo = pCVar15;
      typeInfo->fBaseDatatypeValidator = pDVar13;
      return;
    }
    pDVar14 = SchemaInfo::getTopLevelComponent
                        (*enclosingSchema,0,L"complexType",localPart,enclosingSchema);
    if (pDVar14 != (DOMElement *)0x0) {
      uVar11 = 0;
      uVar9 = traverseComplexTypeDecl(this,pDVar14,true,(XMLCh *)0x0);
      pRVar2 = this->fComplexTypeRegistry;
      iVar10 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[10])
                         (this->fStringPool,(ulong)uVar9);
      key1 = (ushort *)CONCAT44(extraout_var,iVar10);
      if (key1 != (ushort *)0x0) {
        uVar11 = (ulong)*key1;
        if (uVar11 == 0) {
          uVar11 = 0;
        }
        else {
          uVar21 = key1[1];
          if (uVar21 != 0) {
            puVar19 = key1 + 2;
            do {
              uVar11 = (ulong)uVar21 + (uVar11 >> 0x18) + uVar11 * 0x26;
              uVar21 = *puVar19;
              puVar19 = puVar19 + 1;
            } while (uVar21 != 0);
          }
          uVar11 = uVar11 % pRVar2->fHashModulus;
        }
      }
      pRVar18 = pRVar2->fBucketList[uVar11];
      if (pRVar18 != (RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *)0x0) {
        do {
          bVar25 = StringHasher::equals((StringHasher *)&pRVar2->field_0x30,key1,pRVar18->fKey);
          if (bVar25) goto LAB_0033a6e8;
          pRVar18 = pRVar18->fNext;
        } while (pRVar18 != (RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *)0x0);
      }
      pRVar18 = (RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *)0x0;
LAB_0033a6e8:
      if (pRVar18 != (RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *)0x0) {
        pCVar15 = pRVar18->fData;
        pDVar13 = (DatatypeValidator *)0x0;
        goto LAB_0033a4fd;
      }
      pDVar13 = (DatatypeValidator *)0x0;
      goto LAB_0033a4fa;
    }
    pDVar14 = SchemaInfo::getTopLevelComponent
                        (*enclosingSchema,1,L"simpleType",localPart,enclosingSchema);
    if (pDVar14 == (DOMElement *)0x0) {
      if (toRestore != *enclosingSchema) {
        restoreSchemaInfo(this,toRestore,local_60,saveScope);
      }
      goto LAB_0033a7e2;
    }
    pCVar15 = (ComplexTypeInfo *)0x0;
    pDVar13 = traverseSimpleTypeDecl(this,pDVar14,true,0);
    if (pDVar13 != (DatatypeValidator *)0x0) goto LAB_0033a4fd;
    if (toRestore != *enclosingSchema) {
      restoreSchemaInfo(this,toRestore,local_60,saveScope);
    }
    iVar10 = 0x28;
    pXVar12 = uriStr;
  }
  else {
    pXVar17 = uriStr;
    if (pXVar12 == (XMLCh *)0x0 || uriStr == (XMLCh *)0x0) {
      if (uriStr == (XMLCh *)0x0) {
        if (pXVar12 == (XMLCh *)0x0) goto LAB_0033a223;
LAB_0033a214:
        bVar25 = *pXVar12 == L'\0';
      }
      else {
        bVar25 = *uriStr == L'\0';
        if (bVar25 && pXVar12 != (XMLCh *)0x0) goto LAB_0033a214;
      }
      if (bVar25) goto LAB_0033a223;
    }
    else {
      do {
        XVar20 = *pXVar17;
        if (XVar20 == L'\0') goto LAB_0033a214;
        XVar1 = *pXVar12;
        pXVar12 = pXVar12 + 1;
        pXVar17 = pXVar17 + 1;
      } while (XVar20 == XVar1);
    }
    if (uriStr == L"http://www.w3.org/2001/XMLSchema") {
LAB_0033a382:
      pDVar13 = getDatatypeValidator(this,uriStr,localPart);
      if (pDVar13 != (DatatypeValidator *)0x0) {
        local_60 = INCLUDE;
        pCVar15 = (ComplexTypeInfo *)0x0;
        goto LAB_0033a4d0;
      }
LAB_0033a7e2:
      iVar10 = 0x2b;
      pXVar12 = baseName;
    }
    else {
      pXVar12 = L"http://www.w3.org/2001/XMLSchema";
      pXVar17 = uriStr;
      if (uriStr == (XMLCh *)0x0) {
LAB_0033a321:
        if (*pXVar12 == L'\0') goto LAB_0033a382;
      }
      else {
        do {
          XVar20 = *pXVar17;
          if (XVar20 == L'\0') goto LAB_0033a321;
          XVar1 = *pXVar12;
          pXVar12 = pXVar12 + 1;
          pXVar17 = pXVar17 + 1;
        } while (XVar20 == XVar1);
      }
      iVar10 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                         (this->fURIStringPool,uriStr);
      pVVar3 = this->fImportedNSList;
      if (pVVar3 != (ValueVectorOf<int> *)0x0) {
        uVar11 = pVVar3->fCurCount;
        bVar25 = uVar11 != 0;
        if (uVar11 == 0) {
LAB_0033a631:
          if (!bVar25) goto LAB_0033a7a6;
        }
        else if (*pVVar3->fElemList != iVar10) {
          uVar22 = 0;
          do {
            uVar23 = uVar11;
            if (uVar11 - 1 == uVar22) break;
            uVar23 = uVar22 + 1;
            lVar8 = uVar22 + 1;
            uVar22 = uVar23;
          } while (pVVar3->fElemList[lVar8] != iVar10);
          bVar25 = uVar23 < uVar11;
          goto LAB_0033a631;
        }
        pCVar15 = getTypeInfoFromNS(this,elem,uriStr,localPart);
        local_60 = INCLUDE;
        if (pCVar15 == (ComplexTypeInfo *)0x0) {
          pDVar13 = getDatatypeValidator(this,uriStr,localPart);
          if (pDVar13 != (DatatypeValidator *)0x0) goto LAB_0033a4d0;
          pSVar6 = this->fSchemaInfo;
          iVar10 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])();
          pRVar7 = pSVar6->fImportedInfoList;
          if (pRVar7 == (RefVectorOf<xercesc_4_0::SchemaInfo> *)0x0) {
            XVar24 = 0;
          }
          else {
            XVar24 = (pRVar7->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fCurCount;
          }
          if (XVar24 != 0) {
            getAt = 0;
            do {
              toRestore_00 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::elementAt
                                       (&pSVar6->fImportedInfoList->
                                         super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>,getAt);
              if (toRestore_00->fTargetNSURI == iVar10) goto LAB_0033a731;
              getAt = getAt + 1;
            } while (XVar24 != getAt);
          }
          toRestore_00 = (SchemaInfo *)0x0;
LAB_0033a731:
          if ((toRestore_00 == (SchemaInfo *)0x0) || (toRestore_00->fProcessed == true))
          goto LAB_0033a7e2;
          local_60 = IMPORT;
          restoreSchemaInfo(this,toRestore_00,IMPORT,0xfffffffe);
        }
        pDVar13 = (DatatypeValidator *)0x0;
        goto LAB_0033a4d0;
      }
LAB_0033a7a6:
      iVar10 = 0x8e;
      pXVar12 = uriStr;
    }
LAB_0033a802:
    uriStr = (XMLCh *)0x0;
    localPart = (XMLCh *)0x0;
  }
  reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",iVar10,pXVar12,localPart,
                    uriStr,(XMLCh *)0x0);
  puVar16 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar16 = 1;
LAB_0033a81a:
  __cxa_throw(puVar16,&ExceptionCodes::typeinfo,0);
}

Assistant:

void TraverseSchema::processBaseTypeInfo(const DOMElement* const elem,
                                         const XMLCh* const baseName,
                                         const XMLCh* const localPart,
                                         const XMLCh* const uriStr,
                                         ComplexTypeInfo* const typeInfo) {

    SchemaInfo*          saveInfo = fSchemaInfo;
    ComplexTypeInfo*     baseComplexTypeInfo = 0;
    DatatypeValidator*   baseDTValidator = 0;
    SchemaInfo::ListType infoType = SchemaInfo::INCLUDE;
    unsigned int         saveScope = fCurrentScope;

    // check if the base type is from another schema
    if (!XMLString::equals(uriStr, fTargetNSURIString)) {

        // check for datatype validator if it's schema for schema URI
        if (XMLString::equals(uriStr, SchemaSymbols::fgURI_SCHEMAFORSCHEMA)) {

            baseDTValidator = getDatatypeValidator(uriStr, localPart);

            if (!baseDTValidator) {
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BaseTypeNotFound, baseName);
                throw TraverseSchema::InvalidComplexTypeInfo;
            }
        }
        else {

            // Make sure that we have an explicit import statement.
            // Clause 4 of Schema Representation Constraint:
            // http://www.w3.org/TR/xmlschema-1/#src-resolve
            unsigned int uriId = fURIStringPool->addOrFind(uriStr);

            if (!isImportingNS(uriId)) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidNSReference, uriStr);
                throw TraverseSchema::InvalidComplexTypeInfo;
            }

            baseComplexTypeInfo = getTypeInfoFromNS(elem, uriStr, localPart);

            if (!baseComplexTypeInfo) {

              baseDTValidator = getDatatypeValidator(uriStr, localPart);

              if (!baseDTValidator)
              {
                SchemaInfo* impInfo = fSchemaInfo->getImportInfo(fURIStringPool->addOrFind(uriStr));

                if (!impInfo || impInfo->getProcessed())
                {
                    reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BaseTypeNotFound, baseName);
                    throw TraverseSchema::InvalidComplexTypeInfo;
                }

                infoType = SchemaInfo::IMPORT;
                restoreSchemaInfo(impInfo, infoType);
              }
            }
        }
    }
    else {

        fBuffer.set(uriStr);
        fBuffer.append(chComma);
        fBuffer.append(localPart);

        // assume the base is a complexType and try to locate the base type first
        const XMLCh* fullBaseName = fBuffer.getRawBuffer();
        baseComplexTypeInfo = fComplexTypeRegistry->get(fullBaseName);

        // Circular check
        if (baseComplexTypeInfo) {

            if (fCurrentTypeNameStack->containsElement(fStringPool->addOrFind(fullBaseName), fCircularCheckIndex)) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::NoCircularDefinition, fullBaseName);
                throw TraverseSchema::InvalidComplexTypeInfo;
            }
            else if (fCurrentTypeNameStack->containsElement(fStringPool->addOrFind(fullBaseName))) {

                typeInfo->setBaseComplexTypeInfo(baseComplexTypeInfo);
                throw TraverseSchema::RecursingElement;
            }
            else if (baseComplexTypeInfo->getPreprocessed()) {
                baseComplexTypeInfo = 0;
            }
        }
    }

    // if not found, 2 possibilities:
    //           1: ComplexType in question has not been compiled yet;
    //           2: base is SimpleType;
    if (!baseComplexTypeInfo && !baseDTValidator) {

        baseDTValidator = getDatatypeValidator(uriStr, localPart);

        if (baseDTValidator == 0) {

            DOMElement* baseTypeNode = fSchemaInfo->getTopLevelComponent(SchemaInfo::C_ComplexType,
                SchemaSymbols::fgELT_COMPLEXTYPE, localPart, &fSchemaInfo);

            if (baseTypeNode != 0) {

                int baseTypeSymbol = traverseComplexTypeDecl(baseTypeNode);
                baseComplexTypeInfo = fComplexTypeRegistry->get(fStringPool->getValueForId(baseTypeSymbol));
            }
            else {

                baseTypeNode = fSchemaInfo->getTopLevelComponent(SchemaInfo::C_SimpleType,
                    SchemaSymbols::fgELT_SIMPLETYPE, localPart, &fSchemaInfo);

                if (baseTypeNode != 0) {

                    baseDTValidator = traverseSimpleTypeDecl(baseTypeNode);

                    if (baseDTValidator == 0)  {

                        // restore schema information, if necessary
                        if (saveInfo != fSchemaInfo) {
                            restoreSchemaInfo(saveInfo, infoType, saveScope);
                        }

                        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TypeNotFound, uriStr, localPart, uriStr);
                        throw TraverseSchema::InvalidComplexTypeInfo;
                    }
                }
                else {

                    // restore schema information, if necessary
                    if (saveInfo != fSchemaInfo) {
                        restoreSchemaInfo(saveInfo, infoType, saveScope);
                    }
                    reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BaseTypeNotFound, baseName);
                    throw TraverseSchema::InvalidComplexTypeInfo;
                }
            }
        }
    } // end if

    // restore schema information, if necessary
    if (saveInfo != fSchemaInfo) {
        restoreSchemaInfo(saveInfo, infoType, saveScope);
    }

    typeInfo->setBaseComplexTypeInfo(baseComplexTypeInfo);
    typeInfo->setBaseDatatypeValidator(baseDTValidator);
}